

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void __thiscall
DCanvas::FillSimplePoly
          (DCanvas *this,FTexture *tex,FVector2 *points,int npoints,double originx,double originy,
          double scalex,double scaley,DAngle *rotation,FDynamicColormap *colormap,int lightlevel,
          int bottomclip)

{
  double dVar1;
  BYTE *pBVar2;
  undefined8 uVar3;
  bool bVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  int32_t iVar8;
  fixed_t fVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  lighttable_t *local_f8;
  double t;
  DVector2 tex_1;
  int x2;
  int x1;
  int y3_1;
  fixed_t xinc_1;
  int y3;
  fixed_t xinc;
  BYTE *destorgsave;
  double sinrot;
  double cosrot;
  fixed_t local_90;
  int iStack_8c;
  bool dorotate;
  fixed_t x;
  int y;
  int y2;
  int y1;
  int i;
  int pt2;
  int pt1;
  int botpt;
  int toppt;
  float rightx;
  float leftx;
  float boty;
  float topy;
  fixed_t shade;
  FDynamicColormap *colormap_local;
  DAngle *rotation_local;
  double scaley_local;
  double scalex_local;
  double originy_local;
  double originx_local;
  int npoints_local;
  FVector2 *points_local;
  FTexture *tex_local;
  DCanvas *this_local;
  
  bVar4 = TAngle<double>::operator!=(rotation,0.0);
  uVar3 = swrenderer::drawerargs::dc_destorg;
  iVar6 = npoints + -1;
  if ((1 < iVar6) && (this->Buffer != (BYTE *)0x0)) {
    if (bottomclip < 1) {
      bottomclip = this->Height;
    }
    pt1 = 0;
    pt2 = 0;
    rightx = points->Y;
    botpt = (int)points->X;
    toppt = botpt;
    leftx = rightx;
    for (y2 = 1; y2 <= iVar6; y2 = y2 + 1) {
      if (points[y2].Y < leftx) {
        leftx = points[y2].Y;
        pt1 = y2;
      }
      if (rightx < points[y2].Y) {
        rightx = points[y2].Y;
        pt2 = y2;
      }
      if (points[y2].X < (float)toppt) {
        toppt = (int)points[y2].X;
      }
      if ((float)botpt < points[y2].X) {
        botpt = (int)points[y2].X;
      }
    }
    if ((((leftx < (float)bottomclip) && (0.0 < rightx)) && ((float)toppt < (float)this->Width)) &&
       (0.0 < (float)botpt)) {
      swrenderer::drawerargs::dc_destorg = GetBuffer((DCanvas *)screen);
      if (swrenderer::drawerargs::dc_destorg == (BYTE *)0x0) {
        I_FatalError("Attempt to write to buffer of hardware canvas");
      }
      dVar13 = (tex->Scale).X;
      dVar1 = (tex->Scale).Y;
      dVar11 = TAngle<double>::Radians(rotation);
      dVar11 = cos(dVar11);
      dVar12 = TAngle<double>::Radians(rotation);
      dVar12 = sin(dVar12);
      swrenderer::R_SetupSpanBits(tex);
      if (colormap == (FDynamicColormap *)0x0) {
        local_f8 = swrenderer::identitymap;
      }
      else {
        pBVar2 = colormap->Maps;
        iVar7 = clamp<int>((lightlevel + 0xc) * -0x4000 + 0x340000 >> 0x10,0,0x1f);
        local_f8 = pBVar2 + (iVar7 << 8);
      }
      swrenderer::R_SetSpanColormap(local_f8);
      swrenderer::R_SetSpanSource(tex);
      if (_ds_xbits == 0) {
        scaley_local = 0.0;
        swrenderer::drawerargs::ds_xstep = 0;
      }
      else {
        scaley_local = (double)(uint)(1 << (-swrenderer::drawerargs::ds_xbits & 0x1fU)) /
                       (scalex / dVar13);
        swrenderer::drawerargs::ds_xstep = xs_RoundToInt((real64)(dVar11 * scaley_local));
      }
      if (_ds_ybits == 0) {
        rotation_local = (DAngle *)0x0;
        swrenderer::drawerargs::ds_ystep = 0;
      }
      else {
        rotation_local =
             (DAngle *)
             ((double)(uint)(1 << (-swrenderer::drawerargs::ds_ybits & 0x1fU)) / (scaley / dVar1));
        swrenderer::drawerargs::ds_ystep = xs_RoundToInt((real64)(dVar12 * (double)rotation_local));
      }
      i = pt1;
      y1 = pt1 + 1;
      if (iVar6 < y1) {
        y1 = 0;
      }
      y = xs_RoundToInt((real64)(double)(points[pt1].Y + 0.5));
      do {
        iVar7 = y1;
        local_90 = FloatToFixed((double)(points[i].X + 0.5));
        iVar8 = xs_RoundToInt((real64)(double)(points[y1].Y + 0.5));
        if (((y < iVar8) && ((-1 < y || (-1 < iVar8)))) &&
           ((y < bottomclip || (iVar8 < bottomclip)))) {
          fVar9 = FloatToFixed((double)((points[y1].X - points[i].X) / (points[y1].Y - points[i].Y))
                              );
          iVar10 = MIN<int>(iVar8,bottomclip);
          if (y < 0) {
            local_90 = fVar9 * -y + local_90;
            y = 0;
          }
          for (iStack_8c = y; iStack_8c < iVar10; iStack_8c = iStack_8c + 1) {
            sVar5 = clamp<short>((short)((uint)local_90 >> 0x10),-1,(short)this->Width);
            spanend[iStack_8c] = sVar5;
            local_90 = fVar9 + local_90;
          }
        }
        i = y1;
        y1 = y1 + 1;
        if (iVar6 < y1) {
          y1 = 0;
        }
        y = iVar8;
      } while (iVar7 != pt2);
      i = pt1;
      y1 = pt1 + -1;
      if (pt1 + -1 < 0) {
        y1 = iVar6;
      }
      y = xs_RoundToInt((real64)(double)(points[pt1].Y + 0.5));
      do {
        iVar7 = y1;
        local_90 = FloatToFixed((double)(points[i].X + 0.5));
        iVar8 = xs_RoundToInt((real64)(double)(points[y1].Y + 0.5));
        if (((y < iVar8) && ((-1 < y || (-1 < iVar8)))) &&
           ((y < bottomclip || (iVar8 < bottomclip)))) {
          fVar9 = FloatToFixed((double)((points[y1].X - points[i].X) / (points[y1].Y - points[i].Y))
                              );
          iVar10 = MIN<int>(iVar8,bottomclip);
          if (y < 0) {
            local_90 = fVar9 * -y + local_90;
            y = 0;
          }
          for (iStack_8c = y; iStack_8c < iVar10; iStack_8c = iStack_8c + 1) {
            tex_1.Y._4_4_ = local_90 >> 0x10;
            tex_1.Y._0_4_ = (int)spanend[iStack_8c];
            if (((tex_1.Y._4_4_ < tex_1.Y._0_4_) && (0 < tex_1.Y._0_4_)) &&
               (tex_1.Y._4_4_ < this->Width)) {
              tex_1.Y._4_4_ = MAX<int>(tex_1.Y._4_4_,0);
              tex_1.Y._0_4_ = MIN<int>(tex_1.Y._0_4_,this->Width);
              swrenderer::drawerargs::ds_y = iStack_8c;
              swrenderer::drawerargs::ds_x1 = tex_1.Y._4_4_;
              swrenderer::drawerargs::ds_x2 = tex_1.Y._0_4_ + -1;
              TVector2<double>::TVector2
                        ((TVector2<double> *)&t,(double)tex_1.Y._4_4_ - originx,
                         (double)iStack_8c - originy);
              if (bVar4) {
                dVar13 = tex_1.X * dVar12;
                tex_1.X = tex_1.X * dVar11 + t * dVar12;
                t = t * dVar11 - dVar13;
              }
              swrenderer::drawerargs::ds_xfrac = xs_RoundToInt((real64)(t * scaley_local));
              swrenderer::drawerargs::ds_yfrac =
                   xs_RoundToInt((real64)(tex_1.X * (double)rotation_local));
              swrenderer::R_DrawSpan();
            }
            local_90 = fVar9 + local_90;
          }
        }
        i = y1;
        y1 = y1 + -1;
        if (y1 < 0) {
          y1 = iVar6;
        }
        y = iVar8;
      } while (iVar7 != pt2);
    }
  }
  swrenderer::drawerargs::dc_destorg = (BYTE *)uVar3;
  return;
}

Assistant:

void DCanvas::FillSimplePoly(FTexture *tex, FVector2 *points, int npoints,
	double originx, double originy, double scalex, double scaley, DAngle rotation,
	FDynamicColormap *colormap, int lightlevel, int bottomclip)
{
#ifndef NO_SWRENDER
	using namespace swrenderer;
	using namespace drawerargs;

	// Use an equation similar to player sprites to determine shade
	fixed_t shade = LIGHT2SHADE(lightlevel) - 12*FRACUNIT;
	float topy, boty, leftx, rightx;
	int toppt, botpt, pt1, pt2;
	int i;
	int y1, y2, y;
	fixed_t x;
	bool dorotate = rotation != 0.;
	double cosrot, sinrot;

	if (--npoints < 2 || Buffer == NULL)
	{ // not a polygon or we're not locked
		return;
	}

	if (bottomclip <= 0)
	{
		bottomclip = Height;
	}

	// Find the extents of the polygon, in particular the highest and lowest points.
	for (botpt = toppt = 0, boty = topy = points[0].Y, leftx = rightx = points[0].X, i = 1; i <= npoints; ++i)
	{
		if (points[i].Y < topy)
		{
			topy = points[i].Y;
			toppt = i;
		}
		if (points[i].Y > boty)
		{
			boty = points[i].Y;
			botpt = i;
		}
		if (points[i].X < leftx)
		{
			leftx = points[i].X;
		}
		if (points[i].X > rightx)
		{
			rightx = points[i].X;
		}
	}
	if (topy >= bottomclip ||	// off the bottom of the screen
		boty <= 0 ||			// off the top of the screen
		leftx >= Width ||		// off the right of the screen
		rightx <= 0)			// off the left of the screen
	{
		return;
	}

	BYTE *destorgsave = dc_destorg;
	dc_destorg = screen->GetBuffer();
	if (dc_destorg == NULL)
	{
		I_FatalError("Attempt to write to buffer of hardware canvas");
	}

	scalex /= tex->Scale.X;
	scaley /= tex->Scale.Y;

	// Use the CRT's functions here.
	cosrot = cos(rotation.Radians());
	sinrot = sin(rotation.Radians());

	// Setup constant texture mapping parameters.
	R_SetupSpanBits(tex);
	R_SetSpanColormap(colormap != NULL ? &colormap->Maps[clamp(shade >> FRACBITS, 0, NUMCOLORMAPS-1) * 256] : identitymap);
	R_SetSpanSource(tex);
	if (ds_xbits != 0)
	{
		scalex = double(1u << (32 - ds_xbits)) / scalex;
		ds_xstep = xs_RoundToInt(cosrot * scalex);
	}
	else
	{ // Texture is one pixel wide.
		scalex = 0;
		ds_xstep = 0;
	}
	if (ds_ybits != 0)
	{
		scaley = double(1u << (32 - ds_ybits)) / scaley;
		ds_ystep = xs_RoundToInt(sinrot * scaley);
	}
	else
	{ // Texture is one pixel tall.
		scaley = 0;
		ds_ystep = 0;
	}

	// Travel down the right edge and create an outline of that edge.
	pt1 = toppt;
	pt2 = toppt + 1;	if (pt2 > npoints) pt2 = 0;
	y1 = xs_RoundToInt(points[pt1].Y + 0.5f);
	do
	{
		x = FLOAT2FIXED(points[pt1].X + 0.5f);
		y2 = xs_RoundToInt(points[pt2].Y + 0.5f);
		if (y1 >= y2 || (y1 < 0 && y2 < 0) || (y1 >= bottomclip && y2 >= bottomclip))
		{
		}
		else
		{
			fixed_t xinc = FLOAT2FIXED((points[pt2].X - points[pt1].X) / (points[pt2].Y - points[pt1].Y));
			int y3 = MIN(y2, bottomclip);
			if (y1 < 0)
			{
				x += xinc * -y1;
				y1 = 0;
			}
			for (y = y1; y < y3; ++y)
			{
				spanend[y] = clamp<short>(x >> FRACBITS, -1, Width);
				x += xinc;
			}
		}
		y1 = y2;
		pt1 = pt2;
		pt2++;			if (pt2 > npoints) pt2 = 0;
	} while (pt1 != botpt);

	// Travel down the left edge and fill it in.
	pt1 = toppt;
	pt2 = toppt - 1;	if (pt2 < 0) pt2 = npoints;
	y1 = xs_RoundToInt(points[pt1].Y + 0.5f);
	do
	{
		x = FLOAT2FIXED(points[pt1].X + 0.5f);
		y2 = xs_RoundToInt(points[pt2].Y + 0.5f);
		if (y1 >= y2 || (y1 < 0 && y2 < 0) || (y1 >= bottomclip && y2 >= bottomclip))
		{
		}
		else
		{
			fixed_t xinc = FLOAT2FIXED((points[pt2].X - points[pt1].X) / (points[pt2].Y - points[pt1].Y));
			int y3 = MIN(y2, bottomclip);
			if (y1 < 0)
			{
				x += xinc * -y1;
				y1 = 0;
			}
			for (y = y1; y < y3; ++y)
			{
				int x1 = x >> FRACBITS;
				int x2 = spanend[y];
				if (x2 > x1 && x2 > 0 && x1 < Width)
				{
					x1 = MAX(x1, 0);
					x2 = MIN(x2, Width);
#if 0
					memset(this->Buffer + y * this->Pitch + x1, (int)tex, x2 - x1);
#else
					ds_y = y;
					ds_x1 = x1;
					ds_x2 = x2 - 1;

					DVector2 tex(x1 - originx, y - originy);
					if (dorotate)
					{
						double t = tex.X;
						tex.X = t * cosrot - tex.Y * sinrot;
						tex.Y = tex.Y * cosrot + t * sinrot;
					}
					ds_xfrac = xs_RoundToInt(tex.X * scalex);
					ds_yfrac = xs_RoundToInt(tex.Y * scaley);

					R_DrawSpan();
#endif
				}
				x += xinc;
			}
		}
		y1 = y2;
		pt1 = pt2;
		pt2--;			if (pt2 < 0) pt2 = npoints;
	} while (pt1 != botpt);
	dc_destorg = destorgsave;
#endif
}